

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceTiledExamples.cpp
# Opt level: O2

void writeTiledRgbaRIP2(char *fileName,int width,int height,int tileWidth,int tileHeight)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int h;
  undefined8 uVar5;
  int tileX;
  int iVar6;
  int xLevel;
  int tileY;
  int yLevel;
  int yLevel_00;
  Box2i range;
  Array2D<Imf_3_2::Rgba> pixels;
  TiledRgbaOutputFile out;
  undefined8 local_38;
  
  local_38 = 0;
  uVar5 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)0x3f800000,0x3f800000,&out,fileName,width,height,tileWidth,
             tileHeight,2,0,0xf,&local_38,0,3,uVar5);
  Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D(&pixels,(long)tileHeight,(long)tileWidth);
  yLevel_00 = 0;
  while( true ) {
    iVar1 = Imf_3_2::TiledRgbaOutputFile::numYLevels();
    if (iVar1 <= yLevel_00) break;
    iVar1 = 0;
    while( true ) {
      iVar2 = Imf_3_2::TiledRgbaOutputFile::numXLevels();
      if (iVar2 <= iVar1) break;
      iVar2 = 0;
      while( true ) {
        iVar6 = (int)(Rgba *)&out;
        iVar3 = Imf_3_2::TiledRgbaOutputFile::numYTiles(iVar6);
        if (iVar3 <= iVar2) break;
        iVar3 = 0;
        while( true ) {
          iVar4 = Imf_3_2::TiledRgbaOutputFile::numXTiles(iVar6);
          if (iVar4 <= iVar3) break;
          Imf_3_2::TiledRgbaOutputFile::dataWindowForTile((int)&range,iVar6,iVar3,iVar2);
          iVar4 = Imf_3_2::TiledRgbaOutputFile::levelWidth(iVar6);
          h = Imf_3_2::TiledRgbaOutputFile::levelHeight(iVar6);
          drawImage5(&pixels,iVar4,h,range.min.x,range.max.x + 1,range.min.y,range.max.y + 1,iVar1,
                     yLevel_00);
          Imf_3_2::TiledRgbaOutputFile::setFrameBuffer
                    ((Rgba *)&out,
                     (ulong)(pixels._data + (-(long)range.min.y * pixels._sizeY - (long)range.min.x)
                            ),1);
          Imf_3_2::TiledRgbaOutputFile::writeTile(iVar6,iVar3,iVar2,iVar1);
          iVar3 = iVar3 + 1;
        }
        iVar2 = iVar2 + 1;
      }
      iVar1 = iVar1 + 1;
    }
    yLevel_00 = yLevel_00 + 1;
  }
  Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(&pixels);
  Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
  return;
}

Assistant:

void
writeTiledRgbaRIP2 (
    const char fileName[], int width, int height, int tileWidth, int tileHeight)
{
    //
    // Write a tiled image with ripmap levels using a tile-sized framebuffer.
    //

    TiledRgbaOutputFile out (
        fileName,
        width,
        height, // image size
        tileWidth,
        tileHeight,    // tile size
        RIPMAP_LEVELS, // level mode
        ROUND_DOWN,    // rounding mode
        WRITE_RGBA);   // channels in file

    Array2D<Rgba> pixels (tileHeight, tileWidth);

    for (int yLevel = 0; yLevel < out.numYLevels (); ++yLevel)
    {
        for (int xLevel = 0; xLevel < out.numXLevels (); ++xLevel)
        {
            for (int tileY = 0; tileY < out.numYTiles (yLevel); ++tileY)
            {
                for (int tileX = 0; tileX < out.numXTiles (xLevel); ++tileX)
                {
                    Box2i range =
                        out.dataWindowForTile (tileX, tileY, xLevel, yLevel);

                    drawImage5 (
                        pixels,
                        out.levelWidth (xLevel),
                        out.levelHeight (yLevel),
                        range.min.x,
                        range.max.x + 1,
                        range.min.y,
                        range.max.y + 1,
                        xLevel,
                        yLevel);

                    out.setFrameBuffer (
                        &pixels[-range.min.y][-range.min.x],
                        1,          // xStride
                        tileWidth); // yStride

                    out.writeTile (tileX, tileY, xLevel, yLevel);
                }
            }
        }
    }
}